

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_compress_advanced
                 (ZSTDMT_CCtx *mtctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,
                 ZSTD_CDict *cdict,ZSTD_parameters params,int overlapLog)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ZSTD_allocFunction p_Var6;
  size_t sVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  ZSTD_CCtx_params in_stack_fffffffffffffe58;
  undefined4 local_118;
  ZSTD_strategy ZStack_fc;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 local_b8 [12];
  undefined8 uStack_ac;
  undefined8 local_a4;
  ZSTD_strategy local_9c;
  ZSTD_frameParameters local_98;
  undefined8 local_8c;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 uStack_78;
  undefined8 uStack_70;
  size_t sStack_68;
  int local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ZSTD_freeFunction p_Stack_38;
  void *pvStack_30;
  
  uVar1 = (mtctx->params).format;
  uVar2 = *(undefined8 *)&(mtctx->params).forceWindow;
  sVar7 = (mtctx->params).targetCBlockSize;
  uStack_ec = (undefined4)((ulong)*(undefined8 *)&(mtctx->params).fParams.noDictIDFlag >> 0x20);
  uStack_e8 = (undefined4)uVar2;
  uStack_e4 = (undefined4)((ulong)uVar2 >> 0x20);
  uStack_e0 = (undefined4)sVar7;
  uStack_dc = (undefined4)(sVar7 >> 0x20);
  ZStack_fc = params.cParams.strategy;
  if ((uint)overlapLog < 10) {
    uStack_ac = params.cParams._8_8_;
    local_a4 = params.cParams._16_8_;
    uStack_78._0_4_ = (mtctx->params).srcSizeHint;
    uStack_78._4_4_ = (mtctx->params).attachDictPref;
    uStack_70._0_4_ = (mtctx->params).literalCompressionMode;
    uStack_70._4_4_ = (mtctx->params).nbWorkers;
    sStack_68 = (mtctx->params).jobSize;
    local_98.contentSizeFlag = params.fParams.contentSizeFlag;
    local_98.checksumFlag = params.fParams.checksumFlag;
    local_98.noDictIDFlag = params.fParams.noDictIDFlag;
    local_8c = CONCAT44(uStack_e8,uStack_ec);
    uStack_84 = uStack_e4;
    uStack_80 = uStack_e0;
    uStack_7c = uStack_dc;
    local_b8._0_4_ = uVar1;
    local_b8._4_4_ = params.cParams.windowLog;
    local_b8._8_4_ = params.cParams.chainLog;
    local_9c = ZStack_fc;
    local_60 = overlapLog;
    uVar3 = (mtctx->params).ldmParams.minMatchLength;
    uVar4 = (mtctx->params).ldmParams.hashRateLog;
    uVar5 = (mtctx->params).ldmParams.windowLog;
    p_Var6 = (mtctx->params).customMem.customAlloc;
    local_5c._0_4_ = (mtctx->params).rsyncable;
    local_5c._4_4_ = (mtctx->params).ldmParams.enableLdm;
    uStack_54._0_4_ = (mtctx->params).ldmParams.hashLog;
    uStack_54._4_4_ = (mtctx->params).ldmParams.bucketSizeLog;
    uStack_4c = uVar3;
    uStack_48 = uVar4;
    uStack_44 = uVar5;
    uStack_40 = SUB84(p_Var6,0);
    uStack_3c = (undefined4)((ulong)p_Var6 >> 0x20);
    p_Stack_38 = (mtctx->params).customMem.customFree;
    pvStack_30 = (mtctx->params).customMem.opaque;
    puVar9 = (undefined8 *)local_b8;
    puVar10 = (undefined8 *)&stack0xfffffffffffffe58;
    for (lVar8 = 0x12; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar10 = *puVar9;
      puVar9 = puVar9 + 1;
      puVar10 = puVar10 + 1;
    }
    sVar7 = ZSTDMT_compress_advanced_internal
                      (mtctx,dst,dstCapacity,src,srcSize,cdict,in_stack_fffffffffffffe58);
    return sVar7;
  }
  __assert_fail("ZSTD_OVERLAPLOG_MIN <= overlapLog && overlapLog <= ZSTD_OVERLAPLOG_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x4fbd,
                "size_t ZSTDMT_compress_advanced(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_parameters, int)"
               );
}

Assistant:

size_t ZSTDMT_compress_advanced(ZSTDMT_CCtx* mtctx,
                                void* dst, size_t dstCapacity,
                          const void* src, size_t srcSize,
                          const ZSTD_CDict* cdict,
                                ZSTD_parameters params,
                                int overlapLog)
{
    ZSTD_CCtx_params cctxParams = mtctx->params;
    cctxParams.cParams = params.cParams;
    cctxParams.fParams = params.fParams;
    assert(ZSTD_OVERLAPLOG_MIN <= overlapLog && overlapLog <= ZSTD_OVERLAPLOG_MAX);
    cctxParams.overlapLog = overlapLog;
    return ZSTDMT_compress_advanced_internal(mtctx,
                                             dst, dstCapacity,
                                             src, srcSize,
                                             cdict, cctxParams);
}